

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O1

int doBmpTest(char *ext,int width,int align,int height,int pf,int flags)

{
  bool bVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [16];
  undefined6 uVar11;
  unkbyte10 Var12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [14];
  short sVar15;
  undefined4 uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uchar *puVar21;
  char *__s1;
  undefined8 uVar22;
  uchar *buf;
  char *pcVar23;
  uchar uVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  char *pcVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  int iVar32;
  double dVar33;
  int iVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  char cVar42;
  undefined1 uVar43;
  char cVar44;
  char cVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  double dVar49;
  int loadHeight;
  int loadWidth;
  int pixelFormat;
  char filename [80];
  char md5buf [65];
  int local_138;
  int local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  int local_124;
  ulong local_120;
  char *local_118;
  char *local_110;
  uchar *local_108;
  ulong local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  char local_d8 [80];
  double local_88;
  undefined8 uStack_80;
  char local_78 [72];
  char cVar3;
  char cVar4;
  char cVar5;
  
  uVar30 = (width + tjPixelSize[align] * 0x23) - 1U & -width;
  local_134 = 0;
  local_138 = 0;
  local_124 = align;
  iVar17 = strcasecmp(ext,"ppm");
  pcVar23 = "51976530acf75f02beddf5d21149101d";
  if (iVar17 == 0) {
    pcVar23 = "112c682e82ce5de1cca089e20d60000b";
  }
  local_110 = "6d659071b9bfcdee2def22cb58ddadca";
  if (iVar17 == 0) {
    local_110 = "c0c9f772b464d1896326883a5c79c545";
  }
  if (align == 6) {
    local_110 = pcVar23;
  }
  local_130 = uVar30;
  puVar21 = (uchar *)tjAlloc(uVar30 * 0x27);
  if (puVar21 == (uchar *)0x0) {
    pcVar28 = "ERROR: %s\n";
    pcVar23 = "Could not allocate memory";
LAB_00103b3e:
    iVar32 = 0;
    printf(pcVar28,pcVar23);
    exitStatus = -1;
    buf = (uchar *)0x0;
    goto LAB_00103b74;
  }
  local_e0 = (long)align;
  local_e8 = (long)tjRedOffset[local_e0];
  local_f0 = (long)tjGreenOffset[local_e0];
  local_f8 = (long)tjBlueOffset[local_e0];
  iVar17 = tjPixelSize[local_e0];
  uVar30 = 0;
  local_12c = -width;
  local_128 = height;
  local_120 = (ulong)(uint)width;
  local_118 = ext;
  local_108 = puVar21;
  do {
    local_100 = (ulong)uVar30;
    uVar18 = 0x26 - uVar30;
    if ((local_128 & 2) == 0) {
      uVar18 = uVar30;
    }
    uVar29 = (ulong)(uVar30 << 8) * 0xd20d20d3;
    uVar30 = (uint)(uVar29 >> 0x20);
    local_88 = (double)(uVar30 >> 5 & 0xff) / -255.0 + 1.0;
    puVar21 = local_108 + (int)(uVar18 * local_130);
    uVar31 = 0;
    uStack_80 = 0;
    do {
      iVar19 = (int)((uVar31 & 0xffffffff) * 0xd41d41d5 >> 0x20);
      uVar27 = ((uint)((int)uVar31 - iVar19) >> 1) + iVar19 >> 5;
      uVar25 = uVar27 + (uVar30 >> 5);
      memset(puVar21,0,(long)iVar17);
      buf = local_108;
      pcVar23 = local_118;
      uVar18 = local_128;
      uVar24 = (uchar)uVar25;
      if ((int)local_e0 == 0xb) {
        dVar33 = 1.0 - (double)(uVar27 & 0xff) / 255.0;
        dVar48 = 1.0 - (double)(uVar25 & 0xff) / 255.0;
        uVar35 = SUB81(dVar33,0);
        uVar36 = (undefined1)((ulong)dVar33 >> 8);
        uVar37 = (undefined1)((ulong)dVar33 >> 0x10);
        uVar38 = (undefined1)((ulong)dVar33 >> 0x18);
        uVar39 = (undefined1)((ulong)dVar33 >> 0x20);
        uVar40 = (undefined1)((ulong)dVar33 >> 0x28);
        uVar41 = (undefined1)((ulong)dVar33 >> 0x30);
        uVar43 = (undefined1)((ulong)dVar33 >> 0x38);
        if (local_88 <= dVar33) {
          uVar35 = SUB81(local_88,0);
          uVar36 = (undefined1)((ulong)local_88 >> 8);
          uVar37 = (undefined1)((ulong)local_88 >> 0x10);
          uVar38 = (undefined1)((ulong)local_88 >> 0x18);
          uVar39 = (undefined1)((ulong)local_88 >> 0x20);
          uVar40 = (undefined1)((ulong)local_88 >> 0x28);
          uVar41 = (undefined1)((ulong)local_88 >> 0x30);
          uVar43 = (undefined1)((ulong)local_88 >> 0x38);
        }
        if (dVar48 <= (double)CONCAT17(uVar43,CONCAT16(uVar41,CONCAT15(uVar40,CONCAT14(uVar39,
                                                  CONCAT13(uVar38,CONCAT12(uVar37,CONCAT11(uVar36,
                                                  uVar35)))))))) {
          uVar35 = SUB81(dVar48,0);
          uVar36 = (undefined1)((ulong)dVar48 >> 8);
          uVar37 = (undefined1)((ulong)dVar48 >> 0x10);
          uVar38 = (undefined1)((ulong)dVar48 >> 0x18);
          uVar39 = (undefined1)((ulong)dVar48 >> 0x20);
          uVar40 = (undefined1)((ulong)dVar48 >> 0x28);
          uVar41 = (undefined1)((ulong)dVar48 >> 0x30);
          uVar43 = (undefined1)((ulong)dVar48 >> 0x38);
        }
        bVar1 = NAN((double)CONCAT17(uVar43,CONCAT16(uVar41,CONCAT15(uVar40,CONCAT14(uVar39,CONCAT13
                                                  (uVar38,CONCAT12(uVar37,CONCAT11(uVar36,uVar35))))
                                                  ))));
        if ((!bVar1 && (double)CONCAT17(uVar43,CONCAT16(uVar41,CONCAT15(uVar40,CONCAT14(uVar39,
                                                  CONCAT13(uVar38,CONCAT12(uVar37,CONCAT11(uVar36,
                                                  uVar35))))))) != 1.0) || (bVar1)) {
          dVar49 = 1.0 - (double)CONCAT17(uVar43,CONCAT16(uVar41,CONCAT15(uVar40,CONCAT14(uVar39,
                                                  CONCAT13(uVar38,CONCAT12(uVar37,CONCAT11(uVar36,
                                                  uVar35)))))));
          dVar33 = (dVar33 - (double)CONCAT17(uVar43,CONCAT16(uVar41,CONCAT15(uVar40,CONCAT14(uVar39
                                                  ,CONCAT13(uVar38,CONCAT12(uVar37,CONCAT11(uVar36,
                                                  uVar35)))))))) / dVar49;
          auVar46._0_8_ =
               local_88 -
               (double)CONCAT17(uVar43,CONCAT16(uVar41,CONCAT15(uVar40,CONCAT14(uVar39,CONCAT13(
                                                  uVar38,CONCAT12(uVar37,CONCAT11(uVar36,uVar35)))))
                                               ));
          auVar46._8_8_ =
               dVar48 - (double)CONCAT17(uVar43,CONCAT16(uVar41,CONCAT15(uVar40,CONCAT14(uVar39,
                                                  CONCAT13(uVar38,CONCAT12(uVar37,CONCAT11(uVar36,
                                                  uVar35)))))));
          auVar47._8_8_ = dVar49;
          auVar47._0_8_ = dVar49;
          auVar47 = divpd(auVar46,auVar47);
        }
        else {
          auVar47 = ZEXT816(0);
          dVar33 = 0.0;
        }
        iVar20 = (int)((255.0 - auVar47._8_8_ * 255.0) + 0.5);
        iVar34 = (int)((255.0 - (double)CONCAT17(uVar43,CONCAT16(uVar41,CONCAT15(uVar40,CONCAT14(
                                                  uVar39,CONCAT13(uVar38,CONCAT12(uVar37,CONCAT11(
                                                  uVar36,uVar35))))))) * 255.0) + 0.5);
        iVar19 = (int)((255.0 - dVar33 * 255.0) + 0.5);
        iVar32 = (int)((255.0 - auVar47._0_8_ * 255.0) + 0.5);
        cVar42 = (char)((uint)iVar32 >> 0x10);
        cVar44 = (char)((uint)iVar20 >> 0x10);
        cVar45 = (char)((uint)iVar34 >> 0x10);
        uVar11 = CONCAT15((char)((uint)iVar32 >> 8),CONCAT14((char)iVar32,iVar19));
        uVar22 = CONCAT17((char)((uint)iVar32 >> 0x18),CONCAT16(cVar42,uVar11));
        Var12 = CONCAT19((char)((uint)iVar20 >> 8),CONCAT18((char)iVar20,uVar22));
        auVar13[10] = cVar44;
        auVar13._0_10_ = Var12;
        auVar13[0xb] = (char)((uint)iVar20 >> 0x18);
        auVar14[0xc] = (char)iVar34;
        auVar14._0_12_ = auVar13;
        auVar14[0xd] = (char)((uint)iVar34 >> 8);
        auVar10[0xe] = cVar45;
        auVar10._0_14_ = auVar14;
        auVar10[0xf] = (char)((uint)iVar34 >> 0x18);
        sVar6 = (short)iVar19;
        cVar2 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar19 - (0xff < sVar6);
        sVar6 = (short)((uint)iVar19 >> 0x10);
        sVar7 = (short)((uint6)uVar11 >> 0x20);
        cVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar32 - (0xff < sVar7);
        sVar7 = (short)((ulong)uVar22 >> 0x30);
        sVar8 = (short)((unkuint10)Var12 >> 0x40);
        cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar20 - (0xff < sVar8);
        sVar8 = auVar13._10_2_;
        sVar9 = auVar14._12_2_;
        cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar34 - (0xff < sVar9);
        sVar9 = auVar10._14_2_;
        sVar15 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar19 >> 0x10) -
                          (0xff < sVar6),cVar2);
        uVar16 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar42 - (0xff < sVar7),
                          CONCAT12(cVar3,sVar15));
        uVar11 = CONCAT15((0 < sVar8) * (sVar8 < 0x100) * cVar44 - (0xff < sVar8),
                          CONCAT14(cVar4,uVar16));
        sVar6 = (short)((uint)uVar16 >> 0x10);
        sVar7 = (short)((uint6)uVar11 >> 0x20);
        sVar8 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar45 - (0xff < sVar9),
                                 CONCAT16(cVar5,uVar11)) >> 0x30);
        *(uint *)puVar21 =
             CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                      CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                        (0 < sVar15) * (sVar15 < 0x100) * cVar2 - (0xff < sVar15))))
        ;
      }
      else if ((int)local_e0 == 6) {
        *puVar21 = uVar24;
      }
      else {
        puVar21[local_e8] = (uchar)uVar27;
        puVar21[local_f0] = (uchar)(uVar29 >> 0x25);
        puVar21[local_f8] = uVar24;
      }
      uVar31 = uVar31 + 0x100;
      puVar21 = puVar21 + iVar17;
    } while (uVar31 != 0x2300);
    uVar30 = (int)local_100 + 1;
  } while (uVar30 != 0x27);
  pcVar28 = "bu";
  if ((local_128 & 2) == 0) {
    pcVar28 = "td";
  }
  snprintf(local_d8,0x50,"test_bmp_%s_%d_%s.%s",pixFormatStr[align],local_120,pcVar28,local_118);
  iVar17 = tjSaveImage(local_d8,buf,0x23,local_130,0x27,align);
  if (iVar17 == -1) {
    uVar22 = tjGetErrorStr();
    printf("TurboJPEG ERROR:\n%s\n",uVar22);
  }
  else {
    __s1 = MD5File(local_d8,local_78);
    pcVar28 = local_110;
    iVar17 = strcasecmp(__s1,local_110);
    if (iVar17 == 0) {
      tjFree(buf);
      uVar29 = local_120;
      uVar30 = local_128;
      uVar25 = local_128;
      buf = (uchar *)tjLoadImage(local_d8,&local_134,local_120 & 0xffffffff,&local_138);
      if (buf == (uchar *)0x0) goto LAB_00103d66;
      if ((local_134 == 0x23) && (local_138 == 0x27)) {
        iVar17 = cmpBitmap(buf,local_130,align,uVar30,0,uVar25,uVar18);
        if (iVar17 == 0) {
          pcVar23 = "\n   Pixel data in %s is bogus\n";
        }
        else {
          if (align != 6) {
LAB_00103ced:
            tjFree(buf);
            iVar17 = local_124;
            local_124 = -1;
            buf = (uchar *)tjLoadImage(local_d8,&local_134,uVar29 & 0xffffffff,&local_138,&local_124
                                       ,uVar30);
            iVar19 = local_124;
            if (buf == (uchar *)0x0) {
LAB_00103d66:
              pcVar23 = (char *)tjGetErrorStr();
              pcVar28 = "TurboJPEG ERROR:\n%s\n";
              goto LAB_00103b3e;
            }
            lVar26 = (long)local_124;
            if (iVar17 == 6 && local_124 != 6) {
LAB_00103d45:
              printf("\n   tjLoadImage() returned unexpected pixel format: %s\n",
                     pixFormatStr[lVar26]);
              iVar32 = -1;
            }
            else {
              iVar32 = 0;
              if ((iVar17 != 6) &&
                 ((iVar20 = strcasecmp(pcVar23,"bmp"), iVar20 == 0 && iVar19 != 1 ||
                  ((iVar17 != 6 &&
                   (iVar17 = strcasecmp(pcVar23,"ppm"), iVar32 = 0, iVar19 != 0 && iVar17 == 0))))))
              goto LAB_00103d45;
            }
            unlink(local_d8);
            goto LAB_00103b74;
          }
          tjFree(buf);
          uVar25 = uVar30;
          buf = (uchar *)tjLoadImage(local_d8,&local_134,uVar29 & 0xffffffff,&local_138);
          if (buf == (uchar *)0x0) goto LAB_00103d66;
          iVar17 = cmpBitmap(buf,(int)uVar29 + 0x8bU & local_12c,4,uVar30,1,uVar25,uVar18);
          if (iVar17 == 0) {
            pcVar23 = "\n   Converting %s to RGB failed\n";
          }
          else {
            tjFree(buf);
            uVar25 = uVar30;
            buf = (uchar *)tjLoadImage(local_d8,&local_134,uVar29 & 0xffffffff,&local_138);
            if (buf == (uchar *)0x0) goto LAB_00103d66;
            iVar17 = cmpBitmap(buf,(int)uVar29 + 0x8bU & local_12c,0xb,uVar30,1,uVar25,uVar18);
            if (iVar17 != 0) goto LAB_00103ced;
            pcVar23 = "\n   Converting %s to CMYK failed\n";
          }
        }
      }
      else {
        pcVar23 = "\n   Image dimensions of %s are bogus\n";
      }
      printf(pcVar23,local_d8);
      iVar32 = -1;
      goto LAB_00103b74;
    }
    printf("\n%s has an MD5 sum of %s.\n   Should be %s.\n",local_d8,__s1,pcVar28);
  }
  iVar32 = 0;
  exitStatus = -1;
LAB_00103b74:
  tjFree(buf);
  if (exitStatus < 0) {
    iVar32 = exitStatus;
  }
  return iVar32;
}

Assistant:

static int doBmpTest(const char *ext, int width, int align, int height, int pf,
                     int flags)
{
  char filename[80], *md5sum, md5buf[65];
  int ps = tjPixelSize[pf], pitch = PAD(width * ps, align), loadWidth = 0,
    loadHeight = 0, retval = 0, pixelFormat = pf;
  unsigned char *buf = NULL;
  char *md5ref;

  if (pf == TJPF_GRAY) {
    md5ref = !strcasecmp(ext, "ppm") ? "112c682e82ce5de1cca089e20d60000b" :
                                       "51976530acf75f02beddf5d21149101d";
  } else {
    md5ref = !strcasecmp(ext, "ppm") ? "c0c9f772b464d1896326883a5c79c545" :
                                       "6d659071b9bfcdee2def22cb58ddadca";
  }

  if ((buf = (unsigned char *)tjAlloc(pitch * height)) == NULL)
    THROW("Could not allocate memory");
  initBitmap(buf, width, pitch, height, pf, flags);

  snprintf(filename, 80, "test_bmp_%s_%d_%s.%s", pixFormatStr[pf], align,
           (flags & TJFLAG_BOTTOMUP) ? "bu" : "td", ext);
  TRY_TJ(tjSaveImage(filename, buf, width, pitch, height, pf, flags));
  md5sum = MD5File(filename, md5buf);
  if (strcasecmp(md5sum, md5ref))
    THROW_MD5(filename, md5sum, md5ref);

  tjFree(buf);  buf = NULL;
  if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                         flags)) == NULL)
    THROW_TJ();
  if (width != loadWidth || height != loadHeight) {
    printf("\n   Image dimensions of %s are bogus\n", filename);
    retval = -1;  goto bailout;
  }
  if (!cmpBitmap(buf, width, pitch, height, pf, flags, 0)) {
    printf("\n   Pixel data in %s is bogus\n", filename);
    retval = -1;  goto bailout;
  }
  if (pf == TJPF_GRAY) {
    tjFree(buf);  buf = NULL;
    pf = TJPF_XBGR;
    if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                           flags)) == NULL)
      THROW_TJ();
    pitch = PAD(width * tjPixelSize[pf], align);
    if (!cmpBitmap(buf, width, pitch, height, pf, flags, 1)) {
      printf("\n   Converting %s to RGB failed\n", filename);
      retval = -1;  goto bailout;
    }

    tjFree(buf);  buf = NULL;
    pf = TJPF_CMYK;
    if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                           flags)) == NULL)
      THROW_TJ();
    pitch = PAD(width * tjPixelSize[pf], align);
    if (!cmpBitmap(buf, width, pitch, height, pf, flags, 1)) {
      printf("\n   Converting %s to CMYK failed\n", filename);
      retval = -1;  goto bailout;
    }
  }
  /* Verify that tjLoadImage() returns the proper "preferred" pixel format for
     the file type. */
  tjFree(buf);  buf = NULL;
  pf = pixelFormat;
  pixelFormat = TJPF_UNKNOWN;
  if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight,
                         &pixelFormat, flags)) == NULL)
    THROW_TJ();
  if ((pf == TJPF_GRAY && pixelFormat != TJPF_GRAY) ||
      (pf != TJPF_GRAY && !strcasecmp(ext, "bmp") &&
       pixelFormat != TJPF_BGR) ||
      (pf != TJPF_GRAY && !strcasecmp(ext, "ppm") &&
       pixelFormat != TJPF_RGB)) {
    printf("\n   tjLoadImage() returned unexpected pixel format: %s\n",
           pixFormatStr[pixelFormat]);
    retval = -1;
  }
  unlink(filename);

bailout:
  tjFree(buf);
  if (exitStatus < 0) return exitStatus;
  return retval;
}